

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

int BaseSocketImpl::EnumIpAddresses
              (function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
               *fnCallBack,void *vpUser)

{
  sockaddr *__sa;
  bool bVar1;
  int iVar2;
  socklen_t __salen;
  socklen_t __hostlen;
  uint __args_2;
  char *__host;
  uint iIfIndex;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string strAddrBuf;
  ifaddrs *ptr;
  ifaddrs *lstAddr;
  void *pvStack_20;
  int ret;
  void *vpUser_local;
  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  *fnCallBack_local;
  
  lstAddr._4_4_ = 0;
  pvStack_20 = vpUser;
  vpUser_local = fnCallBack;
  iVar2 = getifaddrs(&ptr);
  if (iVar2 == 0) {
    for (strAddrBuf.field_2._8_8_ = ptr; strAddrBuf.field_2._8_8_ != 0;
        strAddrBuf.field_2._8_8_ = *strAddrBuf.field_2._8_8_) {
      if (((*(long *)(strAddrBuf.field_2._8_8_ + 0x18) != 0) &&
          (((**(short **)(strAddrBuf.field_2._8_8_ + 0x18) == 2 ||
            (**(short **)(strAddrBuf.field_2._8_8_ + 0x18) == 10)) &&
           ((*(uint *)(strAddrBuf.field_2._8_8_ + 0x10) & 1) != 0)))) &&
         ((*(uint *)(strAddrBuf.field_2._8_8_ + 0x10) & 8) != 8)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_58,0x401,'\0',&local_59);
        std::allocator<char>::~allocator(&local_59);
        __sa = *(sockaddr **)(strAddrBuf.field_2._8_8_ + 0x18);
        __salen = 0x1c;
        if (__sa->sa_family == 2) {
          __salen = 0x10;
        }
        __host = (char *)std::__cxx11::string::operator[]((ulong)local_58);
        __hostlen = std::__cxx11::string::size();
        iVar2 = getnameinfo(__sa,__salen,__host,__hostlen,(char *)0x0,0,1);
        if (iVar2 == 0) {
          __args_2 = if_nametoindex(*(char **)(strAddrBuf.field_2._8_8_ + 8));
          iVar2 = std::
                  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
                  ::operator()(fnCallBack,(uint)**(ushort **)(strAddrBuf.field_2._8_8_ + 0x18),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_58,__args_2,pvStack_20);
          if (iVar2 == 0) goto LAB_0012db56;
          freeifaddrs(ptr);
          fnCallBack_local._4_4_ = 0x7d;
          bVar1 = true;
        }
        else {
LAB_0012db56:
          bVar1 = false;
        }
        std::__cxx11::string::~string((string *)local_58);
        if (bVar1) {
          return fnCallBack_local._4_4_;
        }
      }
    }
    freeifaddrs(ptr);
  }
  return lstAddr._4_4_;
}

Assistant:

int BaseSocketImpl::EnumIpAddresses(function<int(int, const string&, int, void*)> fnCallBack, void* vpUser)
{
#if defined(_WIN32) || defined(_WIN64)
    ULONG outBufLen = sizeof(IP_ADAPTER_ADDRESSES_LH) * 255;
    auto pAddressList = make_unique<IP_ADAPTER_ADDRESSES_LH[]>(255);
    if (pAddressList == nullptr)
        return ERROR_OUTOFMEMORY;
    DWORD ret = GetAdaptersAddresses(AF_UNSPEC, GAA_FLAG_SKIP_ANYCAST | GAA_FLAG_SKIP_MULTICAST | GAA_FLAG_SKIP_DNS_SERVER, nullptr, &pAddressList[0], &outBufLen);

    if (ret == ERROR_BUFFER_OVERFLOW)
    {
        pAddressList = make_unique<IP_ADAPTER_ADDRESSES_LH[]>(outBufLen / sizeof(IP_ADAPTER_ADDRESSES_LH) + 1);
        if (pAddressList == nullptr)
            return ERROR_OUTOFMEMORY;
        ret = GetAdaptersAddresses(AF_UNSPEC, GAA_FLAG_SKIP_ANYCAST | GAA_FLAG_SKIP_MULTICAST | GAA_FLAG_SKIP_DNS_SERVER, nullptr, &pAddressList[0], &outBufLen);
    }

    if (ret == ERROR_SUCCESS)
    {
        for (PIP_ADAPTER_ADDRESSES pCurrentAddresses = &pAddressList[0]; pCurrentAddresses != nullptr; pCurrentAddresses = pCurrentAddresses->Next)
        {
            if (pCurrentAddresses->IfType == IF_TYPE_SOFTWARE_LOOPBACK || pCurrentAddresses->OperStatus != IfOperStatusUp)
                continue;

            for (PIP_ADAPTER_UNICAST_ADDRESS pUnicast = pCurrentAddresses->FirstUnicastAddress; pUnicast != nullptr; pUnicast = pUnicast->Next)
            {
                if ((pUnicast->Flags & IP_ADAPTER_ADDRESS_TRANSIENT) == IP_ADAPTER_ADDRESS_TRANSIENT)
                    continue;

                string strTmp(255, 0);
                if (pUnicast->Address.lpSockaddr->sa_family == AF_INET6)
                    strTmp = inet_ntop(AF_INET6, &reinterpret_cast<struct sockaddr_in6*>(pUnicast->Address.lpSockaddr)->sin6_addr, &strTmp[0], strTmp.size());
                else
                    strTmp = inet_ntop(AF_INET, &reinterpret_cast<struct sockaddr_in*>(pUnicast->Address.lpSockaddr)->sin_addr, &strTmp[0], strTmp.size());
                if (fnCallBack(pUnicast->Address.lpSockaddr->sa_family, strTmp, pCurrentAddresses->IfIndex, vpUser) != 0)
                {
                    return ERROR_CANCELLED;
                }
            }
        }
    }

#else
    int ret = 0;
    struct ifaddrs* lstAddr;
    if (getifaddrs(&lstAddr) == 0)
    {
        for (struct ifaddrs *ptr = lstAddr; ptr != nullptr; ptr = ptr->ifa_next)
        {
            if (ptr->ifa_addr == nullptr || (ptr->ifa_addr->sa_family != AF_INET && ptr->ifa_addr->sa_family != AF_INET6))
                continue;
            if ((ptr->ifa_flags & IFF_UP) == 0 || (ptr->ifa_flags & IFF_LOOPBACK) == IFF_LOOPBACK)
                continue;
            string strAddrBuf(NI_MAXHOST, 0);
            if (/*&& string(ptr->ifa_name).find("eth") != string::npos &&*/ getnameinfo(ptr->ifa_addr, (ptr->ifa_addr->sa_family == AF_INET) ? sizeof(struct sockaddr_in) : sizeof(struct sockaddr_in6), &strAddrBuf[0], strAddrBuf.size(), NULL, 0, NI_NUMERICHOST) == 0)
            {
                unsigned int iIfIndex = if_nametoindex(ptr->ifa_name);

                if (fnCallBack(ptr->ifa_addr->sa_family, strAddrBuf, iIfIndex, vpUser) != 0)
                {
                    freeifaddrs(lstAddr);
                    return ECANCELED;
                }
            }
        }

        freeifaddrs(lstAddr);
    }
#endif
    return ret;
}